

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_narrow_sat_u8_aarch64(CPUARMState_conflict *env,uint64_t x)

{
  undefined2 uVar1;
  undefined3 uVar2;
  undefined1 uVar3;
  undefined1 local_1b;
  uint32_t res;
  uint8_t d;
  uint16_t s;
  uint64_t x_local;
  CPUARMState_conflict *env_local;
  
  if ((ushort)x < 0x100) {
    local_1b = (undefined1)x;
  }
  else {
    local_1b = 0xff;
    (env->vfp).qc[0] = 1;
  }
  uVar3 = local_1b;
  if ((ushort)(x >> 0x10) < 0x100) {
    local_1b = (undefined1)(x >> 0x10);
  }
  else {
    local_1b = 0xff;
    (env->vfp).qc[0] = 1;
  }
  uVar1 = CONCAT11(local_1b,uVar3);
  if ((ushort)(x >> 0x20) < 0x100) {
    local_1b = (undefined1)(x >> 0x20);
  }
  else {
    local_1b = 0xff;
    (env->vfp).qc[0] = 1;
  }
  uVar2 = CONCAT12(local_1b,uVar1);
  if ((ushort)(x >> 0x30) < 0x100) {
    local_1b = (undefined1)(x >> 0x30);
  }
  else {
    local_1b = 0xff;
    (env->vfp).qc[0] = 1;
  }
  return CONCAT13(local_1b,uVar2);
}

Assistant:

uint32_t HELPER(neon_narrow_sat_u8)(CPUARMState *env, uint64_t x)
{
    uint16_t s;
    uint8_t d;
    uint32_t res = 0;
#define SAT8(n) \
    s = x >> n; \
    if (s > 0xff) { \
        d = 0xff; \
        SET_QC(); \
    } else  { \
        d = s; \
    } \
    res |= (uint32_t)d << (n / 2);

    SAT8(0);
    SAT8(16);
    SAT8(32);
    SAT8(48);
#undef SAT8
    return res;
}